

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

int __thiscall
ON_PolyCurve::IsPolyline
          (ON_PolyCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  uint uVar1;
  ON_Curve *pOVar2;
  ON_3dPoint *pOVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int count;
  long lVar7;
  ulong uVar8;
  double dVar9;
  ON_SimpleArray<double> seg_t;
  ON_SimpleArray<ON_3dPoint> seg_points;
  ON_Interval sdom;
  ON_SimpleArray<double> local_a0;
  ON_Interval local_88;
  ON_SimpleArray<ON_3dPoint> local_78;
  ON_SimpleArray<double> *local_60;
  ulong local_58;
  ON_SimpleArray<double> *local_50;
  ON_SimpleArray<ON_3dPoint> *local_48;
  ON_Interval local_40;
  
  ON_Interval::ON_Interval(&local_40);
  ON_Interval::ON_Interval(&local_88);
  if ((pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) && (-1 < pline_points->m_capacity)) {
    pline_points->m_count = 0;
  }
  if ((pline_t != (ON_SimpleArray<double> *)0x0) && (-1 < pline_t->m_capacity)) {
    pline_t->m_count = 0;
  }
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_58 = (ulong)uVar1;
  if (local_58 == 1) {
    pOVar2 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar2 != (ON_Curve *)0x0) {
      iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2f])
                        (pOVar2,pline_points,pline_t);
      if (pline_t == (ON_SimpleArray<double> *)0x0) {
        return iVar4;
      }
      if (iVar4 < 1) {
        return iVar4;
      }
      pdVar6 = (this->m_t).m_a;
      dVar9 = pdVar6[1];
      ON_Interval::Set(&local_40,*pdVar6,dVar9);
      (*((*(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a)->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x25])();
      if (pline_t->m_count < 1) {
        return iVar4;
      }
      pdVar6 = pline_t->m_a;
      lVar7 = 0;
      local_88.m_t[1] = dVar9;
      do {
        dVar9 = ON_Interval::TransformParameterTo(&local_88,&local_40,pdVar6[lVar7]);
        pdVar6 = pline_t->m_a;
        pdVar6[lVar7] = dVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pline_t->m_count);
      return iVar4;
    }
  }
  else if (1 < (int)uVar1) {
    local_48 = &local_78;
    local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808fd0;
    local_78.m_a = (ON_3dPoint *)0x0;
    local_78.m_count = 0;
    local_78.m_capacity = 0;
    if (pline_points == (ON_SimpleArray<ON_3dPoint> *)0x0) {
      local_48 = (ON_SimpleArray<ON_3dPoint> *)0x0;
    }
    local_50 = &local_a0;
    local_a0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
    local_a0.m_a = (double *)0x0;
    local_a0.m_count = 0;
    local_a0.m_capacity = 0;
    if (pline_t == (ON_SimpleArray<double> *)0x0) {
      local_50 = (ON_SimpleArray<double> *)0x0;
    }
    uVar8 = 0;
    iVar4 = 0;
    local_60 = pline_t;
    do {
      if (-1 < (long)local_78._16_8_) {
        local_78._16_8_ = local_78._16_8_ & 0xffffffff00000000;
      }
      if (-1 < (long)local_a0._16_8_) {
        local_a0._16_8_ = local_a0._16_8_ & 0xffffffff00000000;
      }
      pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8];
      iVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2f])
                        (pOVar2,local_48,local_50);
      if (iVar5 < 2) {
        if ((pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) && (-1 < pline_points->m_capacity))
        {
          pline_points->m_count = 0;
        }
        iVar4 = 0;
        if ((pline_t != (ON_SimpleArray<double> *)0x0) && (iVar4 = 0, -1 < pline_t->m_capacity)) {
          pline_t->m_count = 0;
        }
        break;
      }
      if (pline_t != (ON_SimpleArray<double> *)0x0) {
        pdVar6 = (this->m_t).m_a;
        dVar9 = pdVar6[uVar8 + 1];
        ON_Interval::Set(&local_40,pdVar6[uVar8],dVar9);
        (*((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar8]->super_ON_Geometry).
          super_ON_Object._vptr_ON_Object[0x25])();
        local_88.m_t[1] = dVar9;
        if (0 < local_a0.m_count) {
          lVar7 = 0;
          do {
            dVar9 = ON_Interval::TransformParameterTo(&local_88,&local_40,local_a0.m_a[lVar7]);
            local_a0.m_a[lVar7] = dVar9;
            lVar7 = lVar7 + 1;
            pline_t = local_60;
          } while (lVar7 < local_a0.m_count);
        }
        count = local_a0.m_count;
        if (0 < pline_t->m_count) {
          (*pline_t->_vptr_ON_SimpleArray[2])(pline_t,(ulong)(pline_t->m_count - 1));
          count = local_a0.m_count;
        }
        ON_SimpleArray<double>::Append(pline_t,count,local_a0.m_a);
      }
      if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
        if (0 < pline_points->m_count) {
          (*pline_points->_vptr_ON_SimpleArray[2])(pline_points,(ulong)(pline_points->m_count - 1));
        }
        ON_SimpleArray<ON_3dPoint>::Append(pline_points,local_78.m_count,local_78.m_a);
      }
      iVar4 = iVar4 + -1 + (uint)(uVar8 == 0) + iVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_58);
    iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])(this);
    if (((char)iVar5 == '\x01' && pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) &&
       (lVar7 = (long)pline_points->m_count, 3 < lVar7)) {
      pOVar3 = pline_points->m_a;
      pOVar3[lVar7 + -1].z = pOVar3->z;
      dVar9 = pOVar3->y;
      pOVar3[lVar7 + -1].x = pOVar3->x;
      pOVar3[lVar7 + -1].y = dVar9;
    }
    ON_SimpleArray<double>::~ON_SimpleArray(&local_a0);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_78);
    return iVar4;
  }
  return 0;
}

Assistant:

int ON_PolyCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  int i, seg_i, seg_rc;
  ON_Interval sdom, cdom;
  int rc = 0;
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  const int seg_count = Count();
  if ( seg_count == 1 )
  {
    if ( m_segment[0] )
      rc = m_segment[0]->IsPolyline(pline_points,pline_t);
    if (pline_t && rc > 0)
    {
      sdom.Set(m_t[0],m_t[1]);
      cdom = m_segment[0]->Domain();
      for ( i = 0; i < pline_t->Count(); i++ )
        (*pline_t)[i] = cdom.TransformParameterTo(sdom, (*pline_t)[i]);
    }
  }
  else if (seg_count > 1 )
  {
    ON_SimpleArray<ON_3dPoint> seg_points;
    ON_SimpleArray<double> seg_t;
    for ( seg_i = 0; seg_i < seg_count; seg_i++ )
    {
      seg_points.SetCount(0);
      seg_t.SetCount(0);
      seg_rc = m_segment[seg_i]->IsPolyline(pline_points?&seg_points:0,pline_t?&seg_t:0);
      if ( seg_rc < 2 )
      {
        if ( pline_points )
          pline_points->SetCount(0);
        if ( pline_t )
          pline_t->SetCount(0);
        rc = 0;
        break;
      }
      rc += seg_rc;
      if ( seg_i )
        rc--;
      if ( pline_t )
      {
        sdom.Set( m_t[seg_i], m_t[seg_i+1] );
        cdom = m_segment[seg_i]->Domain();

        for (i = 0; i < seg_t.Count(); i++)
          seg_t[i] = cdom.TransformParameterTo(sdom, seg_t[i]);

        if ( pline_t->Count() > 0 )
          pline_t->Remove();
        pline_t->Append( seg_t.Count(), seg_t.Array() );
      }
      if ( pline_points )
      {
        if ( pline_points->Count() > 0 )
          pline_points->Remove();
        pline_points->Append( seg_points.Count(), seg_points.Array() );
      }
    }
    if(IsClosed() && pline_points && pline_points->Count() > 3)
    {
      // GBA 2/26/03. Make closed polylines spot on closed
      *pline_points->Last() = *pline_points->First();
    }
  }
  return rc;
}